

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_217::SignaturePruning::run(SignaturePruning *this,Module *module)

{
  pointer *pppCVar1;
  pointer *pppCVar2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *pvVar3;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs;
  __node_base_ptr *__dest;
  size_t *this_00;
  pointer puVar4;
  _Storage<wasm::HeapType,_true> *p_Var5;
  pointer ppCVar6;
  iterator __position;
  size_t sVar7;
  long lVar8;
  pointer puVar9;
  iterator __position_00;
  iterator __position_01;
  Export *pEVar10;
  long *plVar11;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
  *p_Var12;
  _Storage<wasm::HeapType,_true> _Var13;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
  *this_01;
  Type TVar14;
  Type TVar15;
  bool bVar16;
  uint uVar17;
  mapped_type_conflict *__args_1;
  _Storage<wasm::HeapType,_true> *p_Var18;
  Function *pFVar19;
  mapped_type *pmVar20;
  Call *pCVar21;
  vector<wasm::Function*,std::allocator<wasm::Function*>> *this_02;
  pointer pTVar22;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar23;
  const_iterator cVar24;
  Type *pTVar25;
  mapped_type *pmVar26;
  long *plVar27;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar28;
  pointer puVar29;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> _Var30;
  _Storage<wasm::HeapType,_true> _Var31;
  _Hash_node_base *p_Var32;
  Module *pMVar33;
  _Link_type_conflict __x;
  __hashtable *__h;
  pointer ppCVar34;
  pointer pTVar35;
  optional<wasm::HeapType> oVar36;
  undefined1 local_458 [8];
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  sigFuncs;
  void *local_378;
  long local_368;
  undefined1 local_340 [16];
  code *local_330;
  undefined1 local_2d0 [8];
  SubTypes subTypes;
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  long local_170;
  Type local_168;
  Type oldParams;
  Tuple local_148;
  undefined1 local_130 [8];
  Signature sig;
  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
  allInfo;
  undefined1 auStack_c8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  undefined1 local_98 [8];
  SortedVector removedIndexes;
  undefined4 uStack_78;
  undefined4 uStack_74;
  Type calledType;
  _Storage<wasm::HeapType,_true> local_58;
  Function *func_1;
  long local_48;
  Module *local_40;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  if (((module->features).features & 0x400) != 0) {
    if ((((this->super_Pass).runner)->options).closedWorld == false) {
      Fatal::Fatal((Fatal *)local_458);
      Fatal::operator<<((Fatal *)local_458,(char (*) [41])"SignaturePruning requires --closed-world"
                       );
      Fatal::~Fatal((Fatal *)local_458);
    }
    if ((module->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (module->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      allInfo._M_h._M_single_bucket = (__node_base_ptr)0x0;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&analysis.map
      ;
      analysis.map._M_t._M_impl._0_4_ = 0;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      puVar28 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_40 = module;
      if (puVar28 != puVar4) {
        do {
          local_458 = (undefined1  [8])
                      (puVar28->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          std::
          map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
          ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                        *)&analysis,(key_type *)local_458);
          puVar28 = puVar28 + 1;
        } while (puVar28 != puVar4);
        puVar28 = (module->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar28 != puVar4) {
          do {
            pFVar19 = (puVar28->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            if (*(char **)((long)&(pFVar19->super_Importable).module + 8) != (char *)0x0) {
              local_2d0 = (undefined1  [8])pFVar19;
              __args_1 = std::
                         map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                         ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                                       *)&analysis,(key_type *)local_2d0);
              local_458 = (undefined1  [8])pFVar19;
              std::
              _Function_handler<void_(wasm::Function_*,_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SignaturePruning.cpp:85:16)>
              ::_M_invoke((_Any_data *)&allInfo._M_h._M_single_bucket,(Function **)local_458,
                          __args_1);
            }
            puVar28 = puVar28 + 1;
          } while (puVar28 != puVar4);
        }
      }
      pMVar33 = local_40;
      local_2d0 = (undefined1  [8])&PTR__PassRunner_00d727e0;
      subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_40;
      subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_40->allocator;
      subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      subTypes.typeSubTypes._M_h._M_buckets._0_1_ = 0;
      subTypes.typeSubTypes._M_h._M_buckets._1_7_ = 0;
      subTypes.typeSubTypes._M_h._M_bucket_count._0_1_ = 0;
      subTypes.typeSubTypes._M_h._9_8_ = 0;
      subTypes.typeSubTypes._M_h._M_before_begin._M_nxt._1_2_ = 0x101;
      subTypes.typeSubTypes._M_h._20_8_ = 0;
      subTypes.typeSubTypes._M_h._28_8_ = 0xffffffff00000002;
      subTypes.typeSubTypes._M_h._M_rehash_policy._4_4_ = 0x14;
      subTypes.typeSubTypes._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
      subTypes.typeSubTypes._M_h._M_single_bucket._4_4_ = 0;
      subTypes.typeSubTypes._M_h._44_8_ = 0;
      std::function<void_(wasm::Function_*,_Info_&)>::function
                ((function<void_(wasm::Function_*,_Info_&)> *)&sig.results,
                 (function<void_(wasm::Function_*,_Info_&)>_conflict *)
                 &allInfo._M_h._M_single_bucket);
      wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::
      run(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::
      ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::
      (anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info&)>)::Mapper::Mapper(wasm::
      Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::run(wasm::
      Module*)::Info,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,wasm::
      (anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info>>>&,std::function<void(wasm
      ::Function*,wasm::(anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info__>_
                (local_458,pMVar33,(Map *)&analysis,(Func *)&sig.results);
      if (sigFuncs.Map._M_h._M_buckets != (__buckets_ptr)local_2d0 &&
          sigFuncs.Map._M_h._M_buckets != (__buckets_ptr)0x0) {
        __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                      ,0x1dc,"void wasm::Pass::setPassRunner(PassRunner *)");
      }
      sigFuncs.Map._M_h._M_buckets = (__buckets_ptr)local_2d0;
      (**(code **)&(((Importable *)local_458)->super_Named).hasExplicitName)(local_458,pMVar33);
      local_458 = (undefined1  [8])&PTR__Mapper_00d75538;
      if (local_330 != (code *)0x0) {
        (*local_330)(local_340,local_340,3);
      }
      if (local_378 != (void *)0x0) {
        operator_delete(local_378,local_368 - (long)local_378);
      }
      local_458 = (undefined1  [8])&PTR__Pass_00d722d8;
      if ((size_type *)sigFuncs.Map._M_h._M_bucket_count != &sigFuncs.Map._M_h._M_element_count) {
        operator_delete((void *)sigFuncs.Map._M_h._M_bucket_count,
                        CONCAT44(sigFuncs.Map._M_h._M_element_count._4_4_,
                                 (undefined4)sigFuncs.Map._M_h._M_element_count) + 1);
      }
      if (allInfo._M_h._M_bucket_count != 0) {
        (*(code *)allInfo._M_h._M_bucket_count)(&sig.results,&sig.results,3);
      }
      PassRunner::~PassRunner((PassRunner *)local_2d0);
      __dest = &allInfo._M_h._M_single_bucket;
      std::
      _Function_handler<void_(wasm::Function_*,_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SignaturePruning.cpp:85:16)>
      ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
      sig.results.id = (uintptr_t)&allInfo._M_h._M_rehash_policy._M_next_resize;
      allInfo._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      allInfo._M_h._M_bucket_count = 0;
      allInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      allInfo._M_h._M_element_count._0_4_ = 0x3f800000;
      allInfo._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      allInfo._M_h._M_rehash_policy._4_4_ = 0;
      allInfo._M_h._M_rehash_policy._M_next_resize = 0;
      local_458 = (undefined1  [8])&sigFuncs.Map._M_h._M_rehash_policy._M_next_resize;
      sigFuncs.Map._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      sigFuncs.Map._M_h._M_bucket_count = 0;
      sigFuncs.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      sigFuncs.Map._M_h._M_element_count._0_4_ = 0x3f800000;
      sigFuncs.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      sigFuncs.Map._M_h._M_rehash_policy._4_4_ = 0;
      sigFuncs.Map._M_h._M_rehash_policy._M_next_resize = 0;
      sigFuncs.Map._M_h._M_single_bucket = (__node_base_ptr)&sigFuncs.Map._M_h._M_single_bucket;
      sigFuncs.List.
      super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      p_Var18 = (_Storage<wasm::HeapType,_true> *)
                (pMVar33->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 = (_Storage<wasm::HeapType,_true> *)
               (pMVar33->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sigFuncs.List.
      super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)sigFuncs.Map._M_h._M_single_bucket;
      if (p_Var18 != p_Var5) {
        pTVar25 = &sig.results;
        do {
          local_58 = *p_Var18;
          removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)p_Var18;
          __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      *)std::
                        map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                        ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                                      *)&analysis,(key_type *)&local_58);
          ppCVar6 = (((mapped_type_conflict *)__range2)->calls).
                    super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (ppCVar34 = (((mapped_type_conflict *)__range2)->calls).
                          super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                          super__Vector_impl_data._M_start; ppCVar34 != ppCVar6;
              ppCVar34 = ppCVar34 + 1) {
            local_2d0 = (undefined1  [8])*ppCVar34;
            pFVar19 = Module::getFunction(local_40,(IString)*(IString *)
                                                             &(((key_type)local_2d0)->
                                                              super_Importable).base.super_IString.
                                                              str._M_str);
            pmVar20 = std::
                      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                      ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                    *)pTVar25,&pFVar19->type);
            __position._M_current =
                 (pmVar20->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pmVar20->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wasm::Call*,std::allocator<wasm::Call*>>::
              _M_realloc_insert<wasm::Call*const&>
                        ((vector<wasm::Call*,std::allocator<wasm::Call*>> *)pmVar20,__position,
                         (Call **)local_2d0);
            }
            else {
              *__position._M_current = (Call *)local_2d0;
              pppCVar1 = &(pmVar20->calls).
                          super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppCVar1 = *pppCVar1 + 1;
            }
            _uStack_78 = (uintptr_t)local_40;
            pCVar21 = Intrinsics::isCallWithoutEffects
                                ((Intrinsics *)&stack0xffffffffffffff88,(Expression *)local_2d0);
            if (pCVar21 != (Call *)0x0) {
              sVar7 = (((Importable *)local_2d0)->module).super_IString.str._M_len;
              if (sVar7 == 0) {
                __assert_fail("usedElements > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                              ,0xd0,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              lVar8 = *(long *)(*(long *)&(((Importable *)local_2d0)->super_Named).hasExplicitName +
                                -8 + sVar7 * 8);
              if (*(long *)(lVar8 + 8) != 1) {
                _uStack_78 = wasm::Type::getHeapType((Type *)(lVar8 + 8));
                pmVar20 = std::
                          unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                          ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                        *)pTVar25,(key_type *)&stack0xffffffffffffff88);
                pmVar20->optimizable = false;
              }
            }
          }
          puVar9 = __range2[1].
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar29 = __range2[1].
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar9;
              puVar29 = puVar29 + 1) {
            local_2d0 = (undefined1  [8])
                        (puVar29->_M_t).
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
            _uStack_78 = *(uintptr_t *)
                          (*(char **)((long)&(((Name *)((long)&((key_type)local_2d0)->
                                                               super_Importable + 0x28))->
                                             super_IString).str + 8) + 8);
            if ((Module *)_uStack_78 != (Module *)&DAT_00000001) {
              local_98 = (undefined1  [8])wasm::Type::getHeapType((Type *)&stack0xffffffffffffff88);
              pmVar20 = std::
                        unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                        ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                      *)pTVar25,(key_type *)local_98);
              __position_00._M_current =
                   (pmVar20->callRefs).
                   super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (pmVar20->callRefs).
                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>::
                _M_realloc_insert<wasm::CallRef*const&>
                          ((vector<wasm::CallRef*,std::allocator<wasm::CallRef*>> *)
                           &pmVar20->callRefs,__position_00,(CallRef **)local_2d0);
              }
              else {
                *__position_00._M_current = (CallRef *)local_2d0;
                pppCVar2 = &(pmVar20->callRefs).
                            super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppCVar2 = *pppCVar2 + 1;
              }
            }
          }
          pmVar20 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)pTVar25,(HeapType *)((long)local_58 + 0x38));
          _Var30._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
               (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
               __range2[2].
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (_Var30._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)0x0) {
            do {
              uStack_78 = *(undefined4 *)
                           &(((pointer)
                             ((long)_Var30._M_t.
                                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                    .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 8))
                            ->_M_t).
                            super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                            .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              local_2d0 = (undefined1  [8])&pmVar20->usedParams;
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&pmVar20->usedParams,(Type *)&stack0xffffffffffffff88,local_2d0);
              _Var30._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                   *(tuple<wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                    _Var30._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
            } while ((__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)
                     _Var30._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
                     (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x0);
          }
          if (*(char *)&__range2[4].
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish == '\0') {
            pmVar20 = std::
                      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                      ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                    *)pTVar25,(HeapType *)((long)local_58 + 0x38));
            pmVar20->optimizable = false;
          }
          this_02 = (vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                    InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                    ::operator[]((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                  *)local_458,(HeapType *)((long)local_58 + 0x38));
          __position_01._M_current = *(Function ***)(this_02 + 8);
          if (__position_01._M_current == *(Function ***)(this_02 + 0x10)) {
            std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
            _M_realloc_insert<wasm::Function*const&>(this_02,__position_01,(Function **)&local_58);
          }
          else {
            *__position_01._M_current = (Function *)local_58;
            *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
          }
          p_Var18 = (_Storage<wasm::HeapType,_true> *)
                    (removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2);
        } while (p_Var18 != p_Var5);
      }
      pMVar33 = local_40;
      puVar29 = (local_40->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = (local_40->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar29 != puVar9) {
        do {
          pEVar10 = (puVar29->_M_t).
                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (pEVar10->kind == Function) {
            pFVar19 = Module::getFunction(pMVar33,(Name)(pEVar10->value).super_IString.str);
            pmVar20 = std::
                      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                      ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                    *)&sig.results,&pFVar19->type);
            pmVar20->optimizable = false;
          }
          puVar29 = puVar29 + 1;
        } while (puVar29 != puVar9);
      }
      SubTypes::SubTypes((SubTypes *)local_2d0,pMVar33);
      if (sigFuncs.Map._M_h._M_single_bucket != (__node_base_ptr)&sigFuncs.Map._M_h._M_single_bucket
         ) {
        p_Var32 = sigFuncs.Map._M_h._M_single_bucket;
        do {
          pvVar3 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)(p_Var32 + 2);
          _local_130 = HeapType::getSignature((HeapType *)pvVar3);
          __range2 = pvVar3;
          pmVar20 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)&sig.results,(key_type *)pvVar3);
          pTVar22 = (pointer)wasm::Type::size((Type *)local_130);
          if ((pmVar20->optimizable != false) &&
             (pvVar23 = SubTypes::getStrictSubTypes
                                  ((SubTypes *)local_2d0,
                                   (HeapType)
                                   (__range2->
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start),
             (pvVar23->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_start ==
             (pvVar23->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish)) {
            oVar36 = HeapType::getSuperType((HeapType *)__range2);
            local_58 = oVar36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
            func_1._0_1_ = oVar36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_engaged;
            if ((((undefined1  [16])
                  oVar36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
                 (undefined1  [16])0x0) ||
               (bVar16 = HeapType::isSignature(&local_58._M_value), !bVar16)) {
              funcs = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)(p_Var32 + 3);
              removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)p_Var32;
              ParamUtils::applyConstantValues
                        ((SortedVector *)&local_58._M_value,funcs,&pmVar20->calls,&pmVar20->callRefs
                         ,pMVar33);
              _Var13._M_value.id._1_7_ = func_1._1_7_;
              _Var13._M_value.id._0_1_ = func_1._0_1_;
              for (_Var31 = local_58; pMVar33 = local_40,
                  p_Var32 = (_Hash_node_base *)
                            removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                            .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage, _Var31 != _Var13;
                  _Var31 = (_Storage<wasm::HeapType,_true>)((long)_Var31 + 4)) {
                uStack_78 = *(undefined4 *)_Var31;
                std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::_M_erase(&(pmVar20->usedParams)._M_h,&stack0xffffffffffffff88);
              }
              if ((pointer)(pmVar20->usedParams)._M_h._M_element_count != pTVar22) {
                _uStack_78 = 0;
                calledType.id = 0;
                local_98 = (undefined1  [8])((ulong)local_98 & 0xffffffff00000000);
                if (pTVar22 != (pointer)0x0) {
                  do {
                    cVar24 = std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(&(pmVar20->usedParams)._M_h,(key_type *)local_98);
                    if (cVar24.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                        (__node_type *)0x0) {
                      SortedVector::insert((SortedVector *)&stack0xffffffffffffff88,local_98._0_4_);
                    }
                    uVar17 = local_98._0_4_ + 1;
                    local_98._0_4_ = uVar17;
                  } while ((pointer)(ulong)uVar17 < pTVar22);
                }
                local_168.id = (uintptr_t)local_130;
                this_00 = &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &stack0xffffffffffffff88);
                ParamUtils::removeParameters
                          ((SortedVector *)local_98,funcs,(SortedVector *)this_00,&pmVar20->calls,
                           &pmVar20->callRefs,pMVar33,(this->super_Pass).runner);
                pvVar3 = __range2;
                if (analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                  operator_delete((void *)analysis.map._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,
                                  local_170 -
                                  analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
                }
                if (local_98 !=
                    (undefined1  [8])
                    removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  auStack_c8 = (undefined1  [8])0x0;
                  newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  if (pTVar22 != (pointer)0x0) {
                    pTVar35 = (pointer)0x0;
                    do {
                      bVar16 = SortedVector::has((SortedVector *)local_98,(Index)pTVar35);
                      if (!bVar16) {
                        local_148.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_start = &local_168;
                        local_148.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_finish = pTVar35;
                        pTVar25 = wasm::Type::Iterator::operator*((Iterator *)&local_148);
                        if (newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start ==
                            newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          std::vector<wasm::Type,std::allocator<wasm::Type>>::
                          _M_realloc_insert<wasm::Type_const&>
                                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_c8,
                                     (iterator)
                                     newParams.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start,pTVar25);
                        }
                        else {
                          (newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id = pTVar25->id;
                          newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start =
                               newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1;
                        }
                      }
                      pTVar35 = (pointer)(ulong)((Index)pTVar35 + 1);
                    } while (pTVar35 < pTVar22);
                  }
                  Tuple::Tuple(&local_148,(TypeList *)auStack_c8);
                  wasm::Type::Type(&oldParams,&local_148);
                  TVar14 = oldParams;
                  TVar15.id = sig.params.id;
                  pmVar26 = std::__detail::
                            _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&this->newSignatures,(key_type *)pvVar3);
                  (pmVar26->params).id = TVar14.id;
                  (pmVar26->results).id = TVar15.id;
                  if (local_148.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
                    operator_delete(local_148.types.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_148.types.
                                          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_148.types.
                                          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  p_Var32 = (_Hash_node_base *)
                            removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                            .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage;
                  plVar27 = *(long **)(removedIndexes.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
                  plVar11 = *(long **)(removedIndexes.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 8);
                  if (plVar27 != plVar11) {
                    puVar29 = (pvVar3->
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    do {
                      *(pointer *)(*plVar27 + 0x38) = puVar29;
                      plVar27 = plVar27 + 1;
                    } while (plVar27 != plVar11);
                  }
                  if (auStack_c8 != (undefined1  [8])0x0) {
                    operator_delete((void *)auStack_c8,
                                    (long)newParams.
                                          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)auStack_c8);
                  }
                }
                if (local_98 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_98,
                                  (long)removedIndexes.
                                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_98)
                  ;
                }
                if ((Module *)_uStack_78 != (Module *)0x0) {
                  operator_delete((void *)_uStack_78,-_uStack_78);
                }
              }
              if (local_58 != (_Storage<wasm::HeapType,_true>)0x0) {
                operator_delete((void *)local_58,local_48 - (long)local_58);
              }
            }
          }
          p_Var32 = p_Var32->_M_nxt;
        } while (p_Var32 != (_Hash_node_base *)&sigFuncs.Map._M_h._M_single_bucket);
      }
      GlobalTypeRewriter::updateSignatures(&this->newSignatures,pMVar33);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&subTypes.types.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      if (local_2d0 != (undefined1  [8])0x0) {
        pMVar33 = (Module *)
                  ((long)subTypes.types.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)local_2d0);
        operator_delete((void *)local_2d0,(ulong)pMVar33);
      }
      std::__cxx11::
      _List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
      ::_M_clear((_List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                  *)&sigFuncs.Map._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_458);
      this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
                 *)allInfo._M_h._M_bucket_count;
      while (this_01 !=
             (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
              *)0x0) {
        p_Var12 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
                    **)this_01;
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_Info>,_true>_>_>
        ::_M_deallocate_node(this_01,(__node_ptr)pMVar33);
        this_01 = p_Var12;
      }
      __x = (_Link_type_conflict)0x0;
      memset((void *)sig.results.id,0,(long)allInfo._M_h._M_buckets << 3);
      allInfo._M_h._M_bucket_count = 0;
      allInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (&allInfo._M_h._M_rehash_policy._M_next_resize != (size_t *)sig.results.id) {
        __x = (_Link_type_conflict)((long)allInfo._M_h._M_buckets << 3);
        operator_delete((void *)sig.results.id,(ulong)__x);
      }
      std::
      _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
      ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                  *)analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "SignaturePruning requires --closed-world";
    }

    if (!module->tables.empty()) {
      // When there are tables we must also take their types into account, which
      // would require us to take call_indirect, element segments, etc. into
      // account. For now, do nothing if there are tables.
      // TODO
      return;
    }

    // First, find all the information we need. Start by collecting inside each
    // function in parallel.

    struct Info {
      std::vector<Call*> calls;
      std::vector<CallRef*> callRefs;

      std::unordered_set<Index> usedParams;

      // If we set this to false, we may not attempt to perform any optimization
      // whatsoever on this data.
      bool optimizable = true;
    };

    ModuleUtils::ParallelFunctionAnalysis<Info> analysis(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Imports cannot be modified.
          info.optimizable = false;
          return;
        }

        info.calls = std::move(FindAll<Call>(func->body).list);
        info.callRefs = std::move(FindAll<CallRef>(func->body).list);
        info.usedParams = ParamUtils::getUsedParams(func);
      });

    // A map of types to all the information combined over all the functions
    // with that type.
    std::unordered_map<HeapType, Info> allInfo;

    // Map heap types to all functions with that type.
    InsertOrderedMap<HeapType, std::vector<Function*>> sigFuncs;

    // Combine all the information we gathered into that map, iterating in a
    // deterministic order as we build up vectors where the order matters.
    for (auto& f : module->functions) {
      auto* func = f.get();
      auto& info = analysis.map[func];

      // For direct calls, add each call to the type of the function being
      // called.
      for (auto* call : info.calls) {
        allInfo[module->getFunction(call->target)->type].calls.push_back(call);

        // Intrinsics limit our ability to optimize in some cases. We will avoid
        // modifying any type that is used by call.without.effects, to avoid
        // the complexity of handling that. After intrinsics are lowered,
        // this optimization will be able to run at full power anyhow.
        if (Intrinsics(*module).isCallWithoutEffects(call)) {
          // The last operand is the actual call target.
          auto* target = call->operands.back();
          if (target->type != Type::unreachable) {
            allInfo[target->type.getHeapType()].optimizable = false;
          }
        }
      }

      // For indirect calls, add each call_ref to the type the call_ref uses.
      for (auto* callRef : info.callRefs) {
        auto calledType = callRef->target->type;
        if (calledType != Type::unreachable) {
          allInfo[calledType.getHeapType()].callRefs.push_back(callRef);
        }
      }

      // A parameter used in this function is used in the heap type - just one
      // function is enough to prevent the parameter from being removed.
      auto& allUsedParams = allInfo[func->type].usedParams;
      for (auto index : info.usedParams) {
        allUsedParams.insert(index);
      }

      if (!info.optimizable) {
        allInfo[func->type].optimizable = false;
      }

      sigFuncs[func->type].push_back(func);
    }

    // Exported functions cannot be modified.
    for (auto& exp : module->exports) {
      if (exp->kind == ExternalKind::Function) {
        auto* func = module->getFunction(exp->value);
        allInfo[func->type].optimizable = false;
      }
    }

    // A type must have the same number of parameters and results as its
    // supertypes and subtypes, so we only attempt to modify types without
    // supertypes or subtypes.
    // TODO We could handle "cycles" where we remove fields from a group of
    //      types with subtyping relations at once.
    SubTypes subTypes(*module);

    // Find parameters to prune.
    //
    // TODO: The order matters here, and more than one cycle can find more work
    //       in some cases, as finding a parameter is a constant and removing it
    //       can lead to another call (that receives that parameter's value) to
    //       now have constant parameters as well, and so it becomes
    //       optimizable. We could do a topological sort or greatest fixed point
    //       analysis to be optimal (that could handle a recursive call with a
    //       constant).
    for (auto& [type, funcs] : sigFuncs) {
      auto sig = type.getSignature();
      auto& info = allInfo[type];
      auto& usedParams = info.usedParams;
      auto numParams = sig.params.size();

      if (!info.optimizable) {
        continue;
      }

      if (!subTypes.getStrictSubTypes(type).empty()) {
        continue;
      }
      if (auto super = type.getSuperType()) {
        if (super->isSignature()) {
          continue;
        }
      }

      // Apply constant indexes: find the parameters that are always sent a
      // constant value, and apply that value in the function. That then makes
      // the parameter unused (since the applied value makes us ignore the value
      // arriving in the parameter).
      auto optimizedIndexes = ParamUtils::applyConstantValues(
        funcs, info.calls, info.callRefs, module);
      for (auto i : optimizedIndexes) {
        usedParams.erase(i);
      }

      if (usedParams.size() == numParams) {
        // All parameters are used, give up on this one.
        continue;
      }

      // We found possible work! Find the specific params that are unused & try
      // to prune them.
      SortedVector unusedParams;
      for (Index i = 0; i < numParams; i++) {
        if (usedParams.count(i) == 0) {
          unusedParams.insert(i);
        }
      }

      auto oldParams = sig.params;
      auto removedIndexes = ParamUtils::removeParameters(funcs,
                                                         unusedParams,
                                                         info.calls,
                                                         info.callRefs,
                                                         module,
                                                         getPassRunner());
      if (removedIndexes.empty()) {
        continue;
      }

      // Success! Update the types.
      std::vector<Type> newParams;
      for (Index i = 0; i < numParams; i++) {
        if (!removedIndexes.has(i)) {
          newParams.push_back(oldParams[i]);
        }
      }

      // Create a new signature. When the TypeRewriter operates below it will
      // modify the existing heap type in place to change its signature to this
      // one (which preserves identity, that is, even if after pruning the new
      // signature is structurally identical to another one, it will remain
      // nominally different from those).
      newSignatures[type] = Signature(Type(newParams), sig.results);

      // removeParameters() updates the type as it goes, but in this pass we
      // need the type to match the other locations, nominally. That is, we need
      // all the functions of a particular type to still have the same type
      // after this operation, and that must be the exact same type at the
      // relevant call_refs and so forth. The TypeRewriter below will do the
      // right thing as it rewrites everything all at once, so we do not want
      // the type to be modified by removeParameters(), and so we undo the type
      // it made.
      //
      // Note that we cannot just ask removeParameters() to not update the type,
      // as it adds a new local there, whose index depends on the type (which
      // contains the # of parameters, and that determine where non-parameter
      // local indexes begin). Rather than have it update the type and then undo
      // that, which would add more complexity in that method, undo the change
      // here.
      for (auto* func : funcs) {
        func->type = type;
      }
    }

    // Rewrite the types.
    GlobalTypeRewriter::updateSignatures(newSignatures, *module);
  }